

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_api.c
# Opt level: O2

WORD32 ihevcd_allocate_static_bufs
                 (iv_obj_t **pps_codec_obj,ihevcd_cxa_create_ip_t *ps_create_ip,
                 ihevcd_cxa_create_op_t *ps_create_op)

{
  IV_COLOR_FORMAT_T IVar1;
  _func_void_ptr_void_ptr_WORD32_WORD32 *p_Var2;
  long lVar3;
  _func_void_ptr_void_ptr_WORD32_WORD32 *p_Var4;
  _func_void_void_ptr_void_ptr *p_Var5;
  UWORD32 UVar6;
  iv_obj_t *piVar7;
  void *__s;
  void *pvVar8;
  undefined8 *puVar9;
  void *pvVar10;
  long lVar11;
  WORD32 WVar12;
  long lVar13;
  long lVar14;
  
  (ps_create_op->s_ivd_create_op_t).pv_handle = (void *)0x0;
  p_Var4 = (ps_create_ip->s_ivd_create_ip_t).pf_aligned_alloc;
  p_Var5 = (ps_create_ip->s_ivd_create_ip_t).pf_aligned_free;
  p_Var2 = (ps_create_ip->s_ivd_create_ip_t).pf_aligned_alloc;
  pvVar10 = (ps_create_ip->s_ivd_create_ip_t).pv_mem_ctxt;
  piVar7 = (iv_obj_t *)(*p_Var2)(pvVar10,0x80,0x18);
  WVar12 = 1;
  if (piVar7 != (iv_obj_t *)0x0) {
    *pps_codec_obj = piVar7;
    (ps_create_op->s_ivd_create_op_t).pv_handle = piVar7;
    (*pps_codec_obj)->pv_codec_handle = (void *)0x0;
    __s = (*p_Var2)(pvVar10,0x80,0x106b8);
    if (__s != (void *)0x0) {
      (*pps_codec_obj)->pv_codec_handle = __s;
      memset(__s,0,0x106b8);
      *(UWORD32 *)((long)__s + 0x38) = (ps_create_ip->s_ivd_create_ip_t).u4_share_disp_buf;
      IVar1 = (ps_create_ip->s_ivd_create_ip_t).e_output_format;
      if ((IV_YUV_420SP_VU < IVar1) || ((0x1802U >> (IVar1 & 0x1f) & 1) == 0)) {
        *(undefined4 *)((long)__s + 0x38) = 0;
      }
      *(IV_COLOR_FORMAT_T *)((long)__s + 0x3c) = IVar1;
      *(_func_void_ptr_void_ptr_WORD32_WORD32 **)((long)__s + 0x3f48) = p_Var4;
      *(_func_void_void_ptr_void_ptr **)((long)__s + 0x3f50) = p_Var5;
      *(void **)((long)__s + 0x3f58) = pvVar10;
      UVar6 = ithread_get_handle_size();
      pvVar8 = (*p_Var2)(pvVar10,0x80,UVar6 * 8);
      if (pvVar8 != (void *)0x0) {
        for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
          UVar6 = ithread_get_handle_size();
          *(long *)((long)__s + lVar14 * 8 + 0x3ea0) =
               (long)(int)((int)lVar14 * UVar6) + (long)pvVar8;
        }
        pvVar8 = (*p_Var2)(pvVar10,0x80,0x100000);
        if (pvVar8 != (void *)0x0) {
          *(void **)((long)__s + 0xb8) = pvVar8;
          *(undefined4 *)((long)__s + 0xcc) = 0x100000;
          pvVar8 = (*p_Var2)(pvVar10,0x80,0x308);
          if (pvVar8 != (void *)0x0) {
            *(void **)((long)__s + 0x160) = pvVar8;
            pvVar8 = (*p_Var2)(pvVar10,0x80,0x410);
            if (pvVar8 != (void *)0x0) {
              *(void **)((long)__s + 0x178) = pvVar8;
              pvVar8 = (*p_Var2)(pvVar10,0x80,0x308);
              if (pvVar8 != (void *)0x0) {
                *(void **)((long)__s + 0x138) = pvVar8;
                pvVar8 = (*p_Var2)(pvVar10,0x80,0x308);
                if (pvVar8 != (void *)0x0) {
                  *(void **)((long)__s + 0x118) = pvVar8;
                  pvVar8 = (*p_Var2)(pvVar10,0x80,0x1c00);
                  if (pvVar8 != (void *)0x0) {
                    memset(pvVar8,0,0x1c00);
                    *(void **)((long)__s + 0x198) = pvVar8;
                    *(void **)((long)__s + 0x380) = pvVar8;
                    pvVar8 = (*p_Var2)(pvVar10,0x80,0x22d48);
                    if (pvVar8 != (void *)0x0) {
                      memset(pvVar8,0,0x22d48);
                      *(void **)((long)__s + 0x1a0) = pvVar8;
                      *(void **)((long)__s + 0x388) = pvVar8;
                      pvVar8 = (*p_Var2)(pvVar10,0x80,0x1450);
                      if (pvVar8 != (void *)0x0) {
                        memset(pvVar8,0,0x1450);
                        *(void **)((long)__s + 0x1a8) = pvVar8;
                        *(void **)((long)__s + 0x390) = pvVar8;
                        pvVar8 = (*p_Var2)(pvVar10,0x80,0x68800);
                        if (pvVar8 != (void *)0x0) {
                          memset(pvVar8,0,0x68800);
                          *(void **)((long)__s + 0x1b0) = pvVar8;
                          *(void **)((long)__s + 0x398) = pvVar8;
                          pvVar8 = (*p_Var2)(pvVar10,0x80,0xa2b80);
                          if (pvVar8 != (void *)0x0) {
                            *(void **)((long)__s + 0x180) = pvVar8;
                            pvVar8 = (*p_Var2)(pvVar10,0x80,0x7c000);
                            if (pvVar8 != (void *)0x0) {
                              *(void **)((long)__s + 0x148) = pvVar8;
                              pvVar8 = (*p_Var2)(pvVar10,0x80,0x40000);
                              if (pvVar8 != (void *)0x0) {
                                for (lVar14 = 0; lVar14 != 0x2500; lVar14 = lVar14 + 0x4a0) {
                                  *(void **)((long)__s + lVar14 + 0x1d80) = pvVar8;
                                  *(long *)((long)__s + lVar14 + 0x1d88) = (long)pvVar8 + 0x4000;
                                  pvVar8 = (void *)((long)pvVar8 + 0x8000);
                                }
                                puVar9 = (undefined8 *)(*p_Var2)(pvVar10,0x80,0x30);
                                if (puVar9 != (undefined8 *)0x0) {
                                  puVar9[4] = 0;
                                  puVar9[5] = 0;
                                  puVar9[2] = 0;
                                  puVar9[3] = 0;
                                  *puVar9 = 0;
                                  puVar9[1] = 0;
                                  *(undefined8 **)((long)__s + 0x378) = puVar9;
                                  *(undefined8 **)((long)__s + 0x370) = puVar9 + 2;
                                  pvVar10 = (void *)(**(code **)((long)__s + 0x3f48))
                                                              (pvVar10,0x80,0x26a00);
                                  if (pvVar10 != (void *)0x0) {
                                    memset(pvVar10,0,0x26a00);
                                    for (lVar14 = 0; lVar14 != 0x2500; lVar14 = lVar14 + 0x4a0) {
                                      *(void **)((long)__s + lVar14 + 0x1ae0) = pvVar10;
                                      *(long *)((long)__s + lVar14 + 0x1ae8) =
                                           (long)pvVar10 + 0x2400;
                                      *(long *)((long)__s + lVar14 + 0x1b30) =
                                           (long)pvVar10 + 0x2400;
                                      *(void **)((long)__s + lVar14 + 0x1b38) = pvVar10;
                                      *(long *)((long)__s + lVar14 + 0x1a40) =
                                           (long)pvVar10 + 0x4800;
                                      *(long *)((long)__s + lVar14 + 0x1c00) =
                                           (long)pvVar10 + 0x4800;
                                      *(undefined4 *)((long)__s + lVar14 + 0x1af8) = 0x40;
                                      pvVar10 = (void *)((long)pvVar10 + 0x4d40);
                                    }
                                    lVar14 = *(long *)((long)__s + 0x180);
                                    lVar11 = *(long *)((long)__s + 0x1a0);
                                    lVar3 = *(long *)((long)__s + 0x1a8);
                                    for (lVar13 = 0x20b8; (int)lVar13 != 0x24e00;
                                        lVar13 = lVar13 + 0x20c8) {
                                      *(long *)(lVar11 + lVar13) = lVar14;
                                      lVar14 = lVar14 + 0x1fc0;
                                    }
                                    WVar12 = 0;
                                    for (lVar11 = 0; (int)lVar11 != 0x1450; lVar11 = lVar11 + 0x50)
                                    {
                                      *(long *)(lVar3 + lVar11) = lVar14;
                                      lVar14 = lVar14 + 0x1fc0;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return WVar12;
}

Assistant:

WORD32 ihevcd_allocate_static_bufs(iv_obj_t **pps_codec_obj,
                                   ihevcd_cxa_create_ip_t *ps_create_ip,
                                   ihevcd_cxa_create_op_t *ps_create_op)
{
    WORD32 size;
    void *pv_buf;
    UWORD8 *pu1_buf;
    WORD32 i;
    codec_t *ps_codec;
    IV_API_CALL_STATUS_T status = IV_SUCCESS;
    void *(*pf_aligned_alloc)(void *pv_mem_ctxt, WORD32 alignment, WORD32 size);
    void (*pf_aligned_free)(void *pv_mem_ctxt, void *pv_buf);
    void *pv_mem_ctxt;

    /* Request memory for HEVCD object */
    ps_create_op->s_ivd_create_op_t.pv_handle = NULL;

    pf_aligned_alloc = ps_create_ip->s_ivd_create_ip_t.pf_aligned_alloc;
    pf_aligned_free = ps_create_ip->s_ivd_create_ip_t.pf_aligned_free;
    pv_mem_ctxt  = ps_create_ip->s_ivd_create_ip_t.pv_mem_ctxt;


    pv_buf = pf_aligned_alloc(pv_mem_ctxt, 128, sizeof(iv_obj_t));
    RETURN_IF((NULL == pv_buf), IV_FAIL);
    *pps_codec_obj = (iv_obj_t *)pv_buf;
    ps_create_op->s_ivd_create_op_t.pv_handle = *pps_codec_obj;


    (*pps_codec_obj)->pv_codec_handle = NULL;
    pv_buf = pf_aligned_alloc(pv_mem_ctxt, 128, sizeof(codec_t));
    RETURN_IF((NULL == pv_buf), IV_FAIL);
    (*pps_codec_obj)->pv_codec_handle = (codec_t *)pv_buf;
    ps_codec = (codec_t *)pv_buf;

    memset(ps_codec, 0, sizeof(codec_t));

#ifndef LOGO_EN
    ps_codec->i4_share_disp_buf = ps_create_ip->s_ivd_create_ip_t.u4_share_disp_buf;
#else
    ps_codec->i4_share_disp_buf = 0;
#endif

    /* Shared display mode is supported only for 420SP and 420P formats */
    if((ps_create_ip->s_ivd_create_ip_t.e_output_format != IV_YUV_420P) &&
       (ps_create_ip->s_ivd_create_ip_t.e_output_format != IV_YUV_420SP_UV) &&
       (ps_create_ip->s_ivd_create_ip_t.e_output_format != IV_YUV_420SP_VU))
    {
        ps_codec->i4_share_disp_buf = 0;
    }

    ps_codec->e_chroma_fmt = ps_create_ip->s_ivd_create_ip_t.e_output_format;

    ps_codec->pf_aligned_alloc = pf_aligned_alloc;
    ps_codec->pf_aligned_free = pf_aligned_free;
    ps_codec->pv_mem_ctxt = pv_mem_ctxt;

    /* Request memory to hold thread handles for each processing thread */
    size = MAX_PROCESS_THREADS * ithread_get_handle_size();
    pv_buf = pf_aligned_alloc(pv_mem_ctxt, 128, size);
    RETURN_IF((NULL == pv_buf), IV_FAIL);

    for(i = 0; i < MAX_PROCESS_THREADS; i++)
    {
        WORD32 handle_size = ithread_get_handle_size();
        ps_codec->apv_process_thread_handle[i] =
                        (UWORD8 *)pv_buf + (i * handle_size);
    }

    /* Request memory for static bitstream buffer which holds bitstream after emulation prevention */
    size = MIN_BITSBUF_SIZE;
    pv_buf = pf_aligned_alloc(pv_mem_ctxt, 128, size);
    RETURN_IF((NULL == pv_buf), IV_FAIL);
    ps_codec->pu1_bitsbuf_static = pv_buf;
    ps_codec->u4_bitsbuf_size_static = size;

    /* size for holding display manager context */
    size = sizeof(buf_mgr_t);
    pv_buf = pf_aligned_alloc(pv_mem_ctxt, 128, size);
    RETURN_IF((NULL == pv_buf), IV_FAIL);
    ps_codec->pv_disp_buf_mgr = pv_buf;

    /* size for holding dpb manager context */
    size = sizeof(dpb_mgr_t);
    pv_buf = pf_aligned_alloc(pv_mem_ctxt, 128, size);
    RETURN_IF((NULL == pv_buf), IV_FAIL);
    ps_codec->pv_dpb_mgr = pv_buf;

    /* size for holding buffer manager context */
    size = sizeof(buf_mgr_t);
    pv_buf = pf_aligned_alloc(pv_mem_ctxt, 128, size);
    RETURN_IF((NULL == pv_buf), IV_FAIL);
    ps_codec->pv_pic_buf_mgr = pv_buf;

    /* size for holding mv buffer manager context */
    size = sizeof(buf_mgr_t);
    pv_buf = pf_aligned_alloc(pv_mem_ctxt, 128, size);
    RETURN_IF((NULL == pv_buf), IV_FAIL);
    ps_codec->pv_mv_buf_mgr = pv_buf;

    size = MAX_VPS_CNT * sizeof(vps_t);
    pv_buf = pf_aligned_alloc(pv_mem_ctxt, 128, size);
    RETURN_IF((NULL == pv_buf), IV_FAIL);
    memset(pv_buf, 0, size);
    ps_codec->ps_vps_base = pv_buf;
    ps_codec->s_parse.ps_vps_base = ps_codec->ps_vps_base;

    size = MAX_SPS_CNT * sizeof(sps_t);
    pv_buf = pf_aligned_alloc(pv_mem_ctxt, 128, size);
    RETURN_IF((NULL == pv_buf), IV_FAIL);
    memset(pv_buf, 0, size);
    ps_codec->ps_sps_base = pv_buf;
    ps_codec->s_parse.ps_sps_base = ps_codec->ps_sps_base;

    size = MAX_PPS_CNT * sizeof(pps_t);
    pv_buf = pf_aligned_alloc(pv_mem_ctxt, 128, size);
    RETURN_IF((NULL == pv_buf), IV_FAIL);
    memset(pv_buf, 0, size);
    ps_codec->ps_pps_base = pv_buf;
    ps_codec->s_parse.ps_pps_base = ps_codec->ps_pps_base;

    size = MAX_SLICE_HDR_CNT * sizeof(slice_header_t);
    pv_buf = pf_aligned_alloc(pv_mem_ctxt, 128, size);
    RETURN_IF((NULL == pv_buf), IV_FAIL);
    memset(pv_buf, 0, size);
    ps_codec->ps_slice_hdr_base = (slice_header_t *)pv_buf;
    ps_codec->s_parse.ps_slice_hdr_base = ps_codec->ps_slice_hdr_base;


    SCALING_MAT_SIZE(size)
    size = (MAX_SPS_CNT + MAX_PPS_CNT) * size * sizeof(WORD16);
    pv_buf = pf_aligned_alloc(pv_mem_ctxt, 128, size);
    RETURN_IF((NULL == pv_buf), IV_FAIL);
    ps_codec->pi2_scaling_mat = (WORD16 *)pv_buf;


    /* Size for holding pic_buf_t for each reference picture
     * Since this is only a structure allocation and not actual buffer allocation,
     * it is allocated for BUF_MGR_MAX_CNT entries
     */
    size = BUF_MGR_MAX_CNT * sizeof(pic_buf_t);
    pv_buf = pf_aligned_alloc(pv_mem_ctxt, 128, size);
    RETURN_IF((NULL == pv_buf), IV_FAIL);
    ps_codec->pv_pic_buf_base = (UWORD8 *)pv_buf;

    /* TO hold scratch buffers needed for each SAO context */
    size = 4 * MAX_CTB_SIZE * MAX_CTB_SIZE;

    /* 2 temporary buffers*/
    size *= 2;
    size *= MAX_PROCESS_THREADS;

    pu1_buf = pf_aligned_alloc(pv_mem_ctxt, 128, size);
    RETURN_IF((NULL == pu1_buf), IV_FAIL);

    for(i = 0; i < MAX_PROCESS_THREADS; i++)
    {
        ps_codec->as_process[i].s_sao_ctxt.pu1_tmp_buf_luma = (UWORD8 *)pu1_buf;
        pu1_buf += 4 * MAX_CTB_SIZE * MAX_CTB_SIZE * sizeof(UWORD8);

        ps_codec->as_process[i].s_sao_ctxt.pu1_tmp_buf_chroma = (UWORD8 *)pu1_buf;
        pu1_buf += 4 * MAX_CTB_SIZE * MAX_CTB_SIZE * sizeof(UWORD8);
    }

    /* Allocate intra pred modes buffer */
    /* 8 bits per 4x4 */
    /* 16 bytes each for top and left 64 pixels and 16 bytes for default mode */
    size =  3 * 16 * sizeof(UWORD8);
    pu1_buf = pf_aligned_alloc(pv_mem_ctxt, 128, size);
    RETURN_IF((NULL == pu1_buf), IV_FAIL);
    memset(pu1_buf, 0, size);
    ps_codec->s_parse.pu1_luma_intra_pred_mode_left = pu1_buf;
    ps_codec->s_parse.pu1_luma_intra_pred_mode_top  = pu1_buf + 16;

    {
        WORD32 inter_pred_tmp_buf_size, ntaps_luma;
        WORD32 pic_pu_idx_map_size;

        /* Max inter pred size */
        ntaps_luma = 8;
        inter_pred_tmp_buf_size = sizeof(WORD16) * (MAX_CTB_SIZE + ntaps_luma) * MAX_CTB_SIZE;

        inter_pred_tmp_buf_size = ALIGN64(inter_pred_tmp_buf_size);

        /* To hold pu_index w.r.t. frame level pu_t array for a CTB */
        pic_pu_idx_map_size = sizeof(WORD32) * (18 * 18);
        pic_pu_idx_map_size = ALIGN64(pic_pu_idx_map_size);

        size =  inter_pred_tmp_buf_size * 2;
        size += pic_pu_idx_map_size;
        size *= MAX_PROCESS_THREADS;

        pu1_buf = ps_codec->pf_aligned_alloc(pv_mem_ctxt, 128, size);
        RETURN_IF((NULL == pu1_buf), IV_FAIL);
        memset(pu1_buf, 0, size);

        for(i = 0; i < MAX_PROCESS_THREADS; i++)
        {
            ps_codec->as_process[i].pi2_inter_pred_tmp_buf1 = (WORD16 *)pu1_buf;
            pu1_buf += inter_pred_tmp_buf_size;

            ps_codec->as_process[i].pi2_inter_pred_tmp_buf2 = (WORD16 *)pu1_buf;
            pu1_buf += inter_pred_tmp_buf_size;

            /* Inverse transform intermediate and inverse scan output buffers reuse inter pred scratch buffers */
            ps_codec->as_process[i].pi2_itrans_intrmd_buf =
                            ps_codec->as_process[i].pi2_inter_pred_tmp_buf2;
            ps_codec->as_process[i].pi2_invscan_out =
                            ps_codec->as_process[i].pi2_inter_pred_tmp_buf1;

            ps_codec->as_process[i].pu4_pic_pu_idx_map = (UWORD32 *)pu1_buf;
            ps_codec->as_process[i].s_bs_ctxt.pu4_pic_pu_idx_map =
                            (UWORD32 *)pu1_buf;
            pu1_buf += pic_pu_idx_map_size;

            //   ps_codec->as_process[i].pi2_inter_pred_tmp_buf3 = (WORD16 *)pu1_buf;
            //   pu1_buf += inter_pred_tmp_buf_size;

            ps_codec->as_process[i].i4_inter_pred_tmp_buf_strd = MAX_CTB_SIZE;

        }
    }
    /* Initialize pointers in PPS structures */
    {
        sps_t *ps_sps = ps_codec->ps_sps_base;
        pps_t *ps_pps = ps_codec->ps_pps_base;
        WORD16 *pi2_scaling_mat =  ps_codec->pi2_scaling_mat;
        WORD32 scaling_mat_size;

        SCALING_MAT_SIZE(scaling_mat_size);

        for(i = 0; i < MAX_SPS_CNT; i++)
        {
            ps_sps->pi2_scaling_mat  = pi2_scaling_mat;
            pi2_scaling_mat += scaling_mat_size;
            ps_sps++;
        }

        for(i = 0; i < MAX_PPS_CNT; i++)
        {
            ps_pps->pi2_scaling_mat  = pi2_scaling_mat;
            pi2_scaling_mat += scaling_mat_size;
            ps_pps++;
        }
    }

    return (status);
}